

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DShadowTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *poVar1;
  TextureFormat log;
  ParameterType *pPVar2;
  TestContext *pTVar3;
  bool bVar4;
  int iVar5;
  deUint32 width;
  deUint32 height;
  TestTexture2D *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pFVar7;
  TextureFormat in_stack_fffffffffffffca8;
  LodPrecision lodPrecision;
  vector<float,_std::allocator<float>_> texCoord;
  ScopedLogSection section;
  undefined1 local_308 [32];
  int local_2e8;
  Surface rendered;
  PixelFormat pixelFormat;
  undefined1 local_290 [76];
  size_type sStack_244;
  size_type local_23c;
  undefined4 uStack_234;
  CompareMode CStack_230;
  int local_22c;
  anon_union_16_3_1194ccdc_for_v local_228;
  undefined8 local_218;
  LodMode local_210;
  TextureFormat texFmt;
  undefined1 local_1f0 [32];
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  
  log = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &this->m_renderer;
  pTVar6 = util::TextureRenderer::get2DTexture
                     (this_00,(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_start[this->m_caseNdx].
                              textureIndex);
  iVar5 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar5);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,"Test",(allocator<char> *)&lodPrecision);
  de::toString<int>((string *)local_308,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texCoord,"Test ",(allocator<char> *)&stack0xfffffffffffffcaf);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rendered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texCoord,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,(TestLog *)log,(string *)local_1f0,(string *)&rendered);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&texCoord);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_308);
  std::__cxx11::string::~string((string *)local_290);
  pFVar7 = (this->m_cases).
           super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_290,TEXTURETYPE_2D);
  width = util::TextureRenderer::getRenderWidth(this_00);
  height = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&rendered,width,height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar2 = this->m_testParameters;
  util::createSampler((Sampler *)local_1f0,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  poVar1 = (ostringstream *)(local_1f0 + 8);
  local_22c = local_1d0;
  local_23c = local_1f0._16_8_;
  local_290._68_8_ = local_1f0._0_8_;
  sStack_244 = local_1f0._8_8_;
  local_228._0_8_ = local_1cc[0]._0_8_;
  local_228._8_8_ = local_1cc[0]._8_8_;
  local_218 = local_1cc[1]._0_8_;
  CStack_230 = (this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  uStack_234 = local_1f0._24_4_;
  local_290._4_4_ = SAMPLERTYPE_SHADOW;
  local_210 = LODMODE_EXACT;
  local_290._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_290._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_290._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_290._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_290._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_290._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_290._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_290._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_290._32_4_ = pFVar7->ref;
  local_1f0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Compare reference value = ");
  std::ostream::operator<<(poVar1,(float)local_290._32_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1f0 + 8);
  local_1f0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Texture coordinates: ");
  tcu::operator<<((ostream *)poVar1,&pFVar7->minCoord);
  std::operator<<((ostream *)poVar1," -> ");
  tcu::operator<<((ostream *)poVar1,&pFVar7->maxCoord);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&pFVar7->minCoord,&pFVar7->maxCoord);
  util::TextureRenderer::renderQuad
            (this_00,&rendered,pFVar7->textureIndex,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_290);
  ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  pixelFormat = getPixelFormat(in_stack_fffffffffffffca8);
  lodPrecision.rule = RULE_VULKAN;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_308);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  local_308._0_8_ = (pointer)0x1400000014;
  local_308._8_4_ = 0;
  local_308._12_4_ = 7;
  local_308._16_4_ = 7;
  local_308._20_4_ = 0;
  local_308._24_4_ = 5;
  local_308._28_4_ = 0x10;
  local_2e8 = pixelFormat.redBits + -1;
  pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
  iVar5 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0x10])(pTVar6);
  bVar4 = verifyTexCompareResult<tcu::Texture2D>
                    (pTVar3,(ConstPixelBufferAccess *)local_1f0,
                     (Texture2D *)CONCAT44(extraout_var_00,iVar5),
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_290,
                     (TexComparePrecision *)local_308,&lodPrecision,&pixelFormat);
  if (bVar4) {
LAB_00786338:
    iVar5 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar5;
    if (iVar5 < (int)(((long)(this->m_cases).
                             super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_cases).
                            super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      tcu::TestStatus::incomplete();
      goto LAB_0078641a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,"Pass",(allocator<char> *)local_308);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1f0);
  }
  else {
    local_1f0._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning: Verification assuming high-quality PCF filtering failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    lodPrecision.lodBits = 4;
    local_308._12_4_ = 4;
    local_308._16_4_ = 4;
    local_308._20_4_ = 0;
    local_308._24_4_ = 0;
    pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
    iVar5 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0x10])(pTVar6);
    bVar4 = verifyTexCompareResult<tcu::Texture2D>
                      (pTVar3,(ConstPixelBufferAccess *)local_1f0,
                       (Texture2D *)CONCAT44(extraout_var_01,iVar5),
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_290,
                       (TexComparePrecision *)local_308,&lodPrecision,&pixelFormat);
    if (bVar4) goto LAB_00786338;
    local_1f0._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "ERROR: Verification against low precision requirements failed, failing test case."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,"Image verification failed",
               (allocator<char> *)&stack0xfffffffffffffcaf);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1f0);
  }
  std::__cxx11::string::~string((string *)local_1f0);
LAB_0078641a:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&rendered);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture2DShadowTestInstance::iterate (void)
{
	tcu::TestLog&					log				= m_context.getTestContext().getLog();
	const pipeline::TestTexture2D&	texture			= m_renderer.get2DTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat		texFmt			= texture.getTextureFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));

	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	vector<float>					texCoord;

	// Setup params for reference.
	sampleParams.sampler			= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.compare	= m_testParameters.compareOp;
	sampleParams.samplerType		= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.colorBias			= fmtInfo.lookupBias;
	sampleParams.colorScale			= fmtInfo.lookupScale;
	sampleParams.ref				= curCase.ref;

	log << TestLog::Message << "Compare reference value = " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	log << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], sampleParams);

	{
		const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
		tcu::TexComparePrecision	texComparePrecision;

		lodPrecision.derivateBits			= 18;
		lodPrecision.lodBits				= 6;
		texComparePrecision.coordBits		= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits			= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits			= 5;
		texComparePrecision.referenceBits	= 16;
		texComparePrecision.resultBits		= pixelFormat.redBits-1;

		const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), rendered.getAccess(), texture.getTexture(),
														  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

			lodPrecision.lodBits			= 4;
			texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
			texComparePrecision.pcfBits		= 0;

			const bool isOk = verifyTexCompareResult(m_context.getTestContext(), rendered.getAccess(), texture.getTexture(),
													 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}